

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalize.cpp
# Opt level: O1

int __thiscall ncnn::Normalize::forward(Normalize *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int *piVar1;
  float fVar2;
  int iVar3;
  uint _c;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  Allocator *pAVar8;
  void *pvVar9;
  int iVar10;
  void *pvVar11;
  float *pfVar12;
  void *pvVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  float *pfVar17;
  ulong uVar18;
  ulong uVar19;
  float fVar20;
  float fVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  Mat square_sum_blob;
  void *ptr;
  void *local_88;
  void *local_48;
  Mat *local_40;
  Normalize *local_38;
  
  iVar10 = bottom_blob->w;
  iVar3 = bottom_blob->h;
  _c = bottom_blob->c;
  uVar19 = (ulong)_c;
  sVar4 = bottom_blob->elemsize;
  local_40 = bottom_blob;
  local_38 = this;
  Mat::create(top_blob,iVar10,iVar3,_c,sVar4,opt->blob_allocator);
  if (top_blob->data == (void *)0x0) {
    return -100;
  }
  if ((long)top_blob->c * top_blob->cstep == 0) {
    return -100;
  }
  uVar14 = iVar3 * iVar10;
  iVar10 = local_38->across_spatial;
  iVar3 = local_38->across_channel;
  if (iVar3 == 0 || iVar10 == 0) {
    if (iVar10 == 0 || iVar3 != 0) {
      if (iVar3 != 0 && iVar10 == 0) {
        pAVar8 = opt->workspace_allocator;
        local_88 = (void *)0x0;
        piVar1 = (int *)0x0;
        if (uVar14 != 0) {
          uVar16 = sVar4 * (long)(int)uVar14 + 3 & 0xfffffffffffffffc;
          if (pAVar8 == (Allocator *)0x0) {
            local_48 = (void *)0x0;
            iVar10 = posix_memalign(&local_48,0x10,uVar16 + 4);
            local_88 = local_48;
            if (iVar10 != 0) {
              local_48 = (void *)0x0;
              local_88 = local_48;
            }
          }
          else {
            local_88 = (void *)(**(code **)(*(long *)pAVar8 + 0x10))(pAVar8,uVar16 + 4);
          }
          piVar1 = (int *)((long)local_88 + uVar16);
          *(undefined4 *)((long)local_88 + uVar16) = 1;
        }
        iVar10 = -100;
        if ((local_88 != (void *)0x0) && ((long)(int)uVar14 != 0)) {
          if (local_38->channel_shared == 0) {
            if (0 < (int)uVar14) {
              pfVar12 = (float *)local_40->data;
              sVar4 = local_40->cstep;
              sVar5 = local_40->elemsize;
              uVar16 = 0;
              do {
                fVar21 = local_38->eps;
                uVar18 = uVar19;
                pfVar17 = pfVar12;
                if (0 < (int)_c) {
                  do {
                    fVar21 = fVar21 + *pfVar17 * *pfVar17;
                    pfVar17 = (float *)((long)pfVar17 + sVar4 * sVar5);
                    uVar18 = uVar18 - 1;
                  } while (uVar18 != 0);
                }
                auVar22 = rsqrtss(ZEXT816(0),ZEXT416((uint)fVar21));
                fVar20 = auVar22._0_4_;
                *(float *)((long)local_88 + uVar16 * 4) =
                     fVar20 * -0.5 * (fVar21 * fVar20 * fVar20 + -3.0);
                uVar16 = uVar16 + 1;
                pfVar12 = pfVar12 + 1;
              } while (uVar16 != uVar14);
            }
            if (0 < (int)_c) {
              pvVar11 = local_40->data;
              sVar4 = local_40->cstep;
              pvVar13 = top_blob->data;
              sVar5 = top_blob->cstep;
              pvVar9 = (local_38->scale_data).data;
              sVar6 = top_blob->elemsize;
              sVar7 = local_40->elemsize;
              uVar16 = 0;
              do {
                if (0 < (int)uVar14) {
                  fVar21 = *(float *)((long)pvVar9 + uVar16 * 4);
                  uVar18 = 0;
                  do {
                    *(float *)((long)pvVar13 + uVar18 * 4) =
                         *(float *)((long)pvVar11 + uVar18 * 4) * fVar21 *
                         *(float *)((long)local_88 + uVar18 * 4);
                    uVar18 = uVar18 + 1;
                  } while (uVar14 != uVar18);
                }
                uVar16 = uVar16 + 1;
                pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar6);
                pvVar11 = (void *)((long)pvVar11 + sVar4 * sVar7);
              } while (uVar16 != uVar19);
            }
          }
          else {
            if (0 < (int)uVar14) {
              fVar21 = *(local_38->scale_data).data;
              pfVar12 = (float *)local_40->data;
              sVar4 = local_40->cstep;
              sVar5 = local_40->elemsize;
              uVar16 = 0;
              do {
                auVar22 = ZEXT416((uint)local_38->eps);
                uVar18 = uVar19;
                pfVar17 = pfVar12;
                if (0 < (int)_c) {
                  do {
                    auVar22._0_4_ = auVar22._0_4_ + *pfVar17 * *pfVar17;
                    pfVar17 = (float *)((long)pfVar17 + sVar4 * sVar5);
                    uVar18 = uVar18 - 1;
                  } while (uVar18 != 0);
                }
                auVar23 = rsqrtss(ZEXT816(0),auVar22);
                fVar20 = auVar23._0_4_;
                *(float *)((long)local_88 + uVar16 * 4) =
                     fVar20 * -0.5 * fVar21 * (auVar22._0_4_ * fVar20 * fVar20 + -3.0);
                uVar16 = uVar16 + 1;
                pfVar12 = pfVar12 + 1;
              } while (uVar16 != uVar14);
            }
            if (0 < (int)_c) {
              pvVar11 = local_40->data;
              sVar4 = local_40->cstep;
              pvVar13 = top_blob->data;
              sVar5 = top_blob->cstep;
              sVar6 = top_blob->elemsize;
              sVar7 = local_40->elemsize;
              uVar16 = 0;
              do {
                if (0 < (int)uVar14) {
                  uVar18 = 0;
                  do {
                    *(float *)((long)pvVar13 + uVar18 * 4) =
                         *(float *)((long)local_88 + uVar18 * 4) *
                         *(float *)((long)pvVar11 + uVar18 * 4);
                    uVar18 = uVar18 + 1;
                  } while (uVar14 != uVar18);
                }
                uVar16 = uVar16 + 1;
                pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar6);
                pvVar11 = (void *)((long)pvVar11 + sVar4 * sVar7);
              } while (uVar16 != uVar19);
            }
          }
          iVar10 = 0;
        }
        if (piVar1 == (int *)0x0) {
          return iVar10;
        }
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 != 0) {
          return iVar10;
        }
        if (pAVar8 != (Allocator *)0x0) {
          (**(code **)(*(long *)pAVar8 + 0x18))();
          return iVar10;
        }
        goto LAB_0014c5cc;
      }
    }
    else if (0 < (int)_c) {
      pvVar11 = local_40->data;
      sVar4 = local_40->cstep;
      pvVar13 = top_blob->data;
      sVar5 = top_blob->cstep;
      iVar10 = local_38->channel_shared;
      sVar6 = local_40->elemsize;
      sVar7 = top_blob->elemsize;
      uVar16 = 0;
      do {
        fVar21 = local_38->eps;
        if (0 < (int)uVar14) {
          uVar18 = 0;
          do {
            fVar20 = *(float *)((long)pvVar11 + uVar18 * 4);
            fVar21 = fVar21 + fVar20 * fVar20;
            uVar18 = uVar18 + 1;
          } while (uVar14 != uVar18);
        }
        if (0 < (int)uVar14) {
          auVar22 = rsqrtss(ZEXT816(0),ZEXT416((uint)fVar21));
          fVar20 = auVar22._0_4_;
          uVar18 = 0;
          if (iVar10 == 0) {
            uVar18 = uVar16;
          }
          fVar2 = *(float *)((long)(local_38->scale_data).data + uVar18 * 4);
          uVar18 = 0;
          do {
            *(float *)((long)pvVar13 + uVar18 * 4) =
                 *(float *)((long)pvVar11 + uVar18 * 4) * fVar2 *
                 fVar20 * -0.5 * (fVar21 * fVar20 * fVar20 + -3.0);
            uVar18 = uVar18 + 1;
          } while (uVar14 != uVar18);
        }
        uVar16 = uVar16 + 1;
        pvVar11 = (void *)((long)pvVar11 + sVar4 * sVar6);
        pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar7);
      } while (uVar16 != uVar19);
    }
    iVar10 = 0;
  }
  else {
    pAVar8 = opt->workspace_allocator;
    local_88 = (void *)0x0;
    piVar1 = (int *)0x0;
    if (_c != 0) {
      uVar16 = sVar4 * (long)(int)_c + 3 & 0xfffffffffffffffc;
      if (pAVar8 == (Allocator *)0x0) {
        local_48 = (void *)0x0;
        iVar10 = posix_memalign(&local_48,0x10,uVar16 + 4);
        local_88 = local_48;
        if (iVar10 != 0) {
          local_48 = (void *)0x0;
          local_88 = local_48;
        }
      }
      else {
        local_88 = (void *)(**(code **)(*(long *)pAVar8 + 0x10))(pAVar8,uVar16 + 4);
      }
      piVar1 = (int *)((long)local_88 + uVar16);
      *(undefined4 *)((long)local_88 + uVar16) = 1;
    }
    iVar10 = -100;
    if ((local_88 != (void *)0x0) && ((long)(int)_c != 0)) {
      uVar16 = (ulong)uVar14;
      if (0 < (int)_c) {
        pvVar11 = local_40->data;
        sVar4 = local_40->cstep;
        sVar5 = local_40->elemsize;
        uVar18 = 0;
        do {
          fVar21 = 0.0;
          if (0 < (int)uVar14) {
            uVar15 = 0;
            do {
              fVar20 = *(float *)((long)pvVar11 + uVar15 * 4);
              fVar21 = fVar21 + fVar20 * fVar20;
              uVar15 = uVar15 + 1;
            } while (uVar16 != uVar15);
          }
          *(float *)((long)local_88 + uVar18 * 4) = fVar21;
          uVar18 = uVar18 + 1;
          pvVar11 = (void *)((long)pvVar11 + sVar4 * sVar5);
        } while (uVar18 != uVar19);
      }
      fVar21 = local_38->eps;
      if (0 < (int)_c) {
        uVar18 = 0;
        do {
          fVar21 = fVar21 + *(float *)((long)local_88 + uVar18 * 4);
          uVar18 = uVar18 + 1;
        } while (uVar19 != uVar18);
      }
      auVar22 = rsqrtss(ZEXT816(0),ZEXT416((uint)fVar21));
      fVar20 = auVar22._0_4_;
      fVar21 = fVar20 * -0.5 * (fVar21 * fVar20 * fVar20 + -3.0);
      if (local_38->channel_shared == 0) {
        if (0 < (int)_c) {
          pvVar11 = local_40->data;
          sVar4 = local_40->cstep;
          pvVar13 = top_blob->data;
          sVar5 = top_blob->cstep;
          sVar6 = top_blob->elemsize;
          pvVar9 = (local_38->scale_data).data;
          sVar7 = local_40->elemsize;
          uVar18 = 0;
          do {
            if (0 < (int)uVar14) {
              fVar20 = *(float *)((long)pvVar9 + uVar18 * 4);
              uVar15 = 0;
              do {
                *(float *)((long)pvVar13 + uVar15 * 4) =
                     *(float *)((long)pvVar11 + uVar15 * 4) * fVar20 * fVar21;
                uVar15 = uVar15 + 1;
              } while (uVar16 != uVar15);
            }
            uVar18 = uVar18 + 1;
            pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar6);
            pvVar11 = (void *)((long)pvVar11 + sVar4 * sVar7);
          } while (uVar18 != uVar19);
        }
      }
      else if (0 < (int)_c) {
        fVar20 = *(local_38->scale_data).data;
        pvVar11 = local_40->data;
        sVar4 = local_40->cstep;
        sVar5 = top_blob->cstep;
        sVar6 = top_blob->elemsize;
        pvVar13 = top_blob->data;
        sVar7 = local_40->elemsize;
        uVar18 = 0;
        do {
          if (0 < (int)uVar14) {
            uVar15 = 0;
            do {
              *(float *)((long)pvVar13 + uVar15 * 4) =
                   *(float *)((long)pvVar11 + uVar15 * 4) * fVar21 * fVar20;
              uVar15 = uVar15 + 1;
            } while (uVar16 != uVar15);
          }
          uVar18 = uVar18 + 1;
          pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar6);
          pvVar11 = (void *)((long)pvVar11 + sVar4 * sVar7);
        } while (uVar18 != uVar19);
      }
      iVar10 = 0;
    }
    if (piVar1 == (int *)0x0) {
      return iVar10;
    }
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 != 0) {
      return iVar10;
    }
    if (pAVar8 != (Allocator *)0x0) {
      (**(code **)(*(long *)pAVar8 + 0x18))();
      return iVar10;
    }
LAB_0014c5cc:
    if (local_88 != (void *)0x0) {
      free(local_88);
    }
  }
  return iVar10;
}

Assistant:

int Normalize::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int size = w * h;

    top_blob.create(w, h, channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (across_spatial && across_channel)
    {
        // square
        Mat square_sum_blob;
        square_sum_blob.create(channels, elemsize, opt.workspace_allocator);
        if (square_sum_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);

            float ssum = 0.f;
            for (int i=0; i<size; i++)
            {
                ssum += ptr[i] * ptr[i];
            }

            square_sum_blob[q] = ssum;
        }

        // sum + eps
        float ssum = eps;
        for (int q=0; q<channels; q++)
        {
            ssum += square_sum_blob[q];
        }

        // 1 / sqrt(ssum)
        float a = 1.f / sqrt(ssum);

        if (channel_shared)
        {
            float scale = a * scale_data[0];

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i=0; i<size; i++)
                {
                    outptr[i] = ptr[i] * scale;
                }
            }
        }
        else
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                float* outptr = top_blob.channel(q);
                float scale = a * scale_data[q];

                for (int i=0; i<size; i++)
                {
                    outptr[i] = ptr[i] * scale;
                }
            }
        }

        return 0;
    }

    if (across_spatial && !across_channel)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);

            float ssum = eps;
            for (int i=0; i<size; i++)
            {
                ssum += ptr[i] * ptr[i];
            }

            float a = 1.f / sqrt(ssum);
            float scale = a * (channel_shared ? scale_data[0] : scale_data[q]);

            for (int i=0; i<size; i++)
            {
                outptr[i] = ptr[i] * scale;
            }
        }

        return 0;
    }

    if (!across_spatial && across_channel)
    {
        // square sum, 1 / sqrt(ssum)
        Mat square_sum_blob;
        square_sum_blob.create(size, elemsize, opt.workspace_allocator);
        if (square_sum_blob.empty())
            return -100;

        if (channel_shared)
        {
            float scale = scale_data[0];

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i=0; i<size; i++)
            {
                float ssum = eps;
                for (int q=0; q<channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);
                    ssum += ptr[i] * ptr[i];
                }

                square_sum_blob[i] = 1.f / sqrt(ssum) * scale;
            }

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i=0; i<size; i++)
                {
                    outptr[i] = ptr[i] * square_sum_blob[i];
                }
            }
        }
        else
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i=0; i<size; i++)
            {
                float ssum = eps;
                for (int q=0; q<channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);
                    ssum += ptr[i] * ptr[i];
                }

                square_sum_blob[i] = 1.f / sqrt(ssum);
            }

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                float* outptr = top_blob.channel(q);
                float scale = scale_data[q];

                for (int i=0; i<size; i++)
                {
                    outptr[i] = ptr[i] * square_sum_blob[i] * scale;
                }
            }
        }

        return 0;
    }

    return 0;
}